

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O3

int print_reasons(BIO *out,char *rname,ASN1_BIT_STRING *rflags,int indent)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  BIT_STRING_BITNAME *pBVar4;
  
  bVar1 = false;
  BIO_printf((BIO *)out,"%*s%s:\n%*s",(ulong)(uint)indent,"",rname,(ulong)(indent + 2),"");
  pBVar4 = reason_flags;
  pcVar3 = "Unused";
  do {
    iVar2 = pBVar4->bitnum;
    while (iVar2 = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)rflags,iVar2), iVar2 == 0) {
      pcVar3 = pBVar4[1].lname;
      if (pcVar3 == (char *)0x0) {
        if (bVar1) goto LAB_00317127;
        pcVar3 = "<EMPTY>\n";
        goto LAB_00317137;
      }
      iVar2 = pBVar4[1].bitnum;
      pBVar4 = pBVar4 + 1;
    }
    if (bVar1) {
      BIO_puts((BIO *)out,", ");
    }
    BIO_puts((BIO *)out,pcVar3);
    pcVar3 = pBVar4[1].lname;
    pBVar4 = pBVar4 + 1;
    bVar1 = true;
  } while (pcVar3 != (char *)0x0);
LAB_00317127:
  pcVar3 = "\n";
LAB_00317137:
  iVar2 = BIO_puts((BIO *)out,pcVar3);
  return iVar2;
}

Assistant:

static int print_reasons(BIO *out, const char *rname, ASN1_BIT_STRING *rflags,
                         int indent) {
  int first = 1;
  const BIT_STRING_BITNAME *pbn;
  BIO_printf(out, "%*s%s:\n%*s", indent, "", rname, indent + 2, "");
  for (pbn = reason_flags; pbn->lname; pbn++) {
    if (ASN1_BIT_STRING_get_bit(rflags, pbn->bitnum)) {
      if (first) {
        first = 0;
      } else {
        BIO_puts(out, ", ");
      }
      BIO_puts(out, pbn->lname);
    }
  }
  if (first) {
    BIO_puts(out, "<EMPTY>\n");
  } else {
    BIO_puts(out, "\n");
  }
  return 1;
}